

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring64_bitmap_add(roaring64_bitmap_t *r,uint64_t val)

{
  ulong uVar1;
  art_val_t *paVar2;
  container_t *pcVar3;
  undefined8 *c;
  container_t *pcVar4;
  leaf_t val_00;
  uint8_t typecode_00;
  uint8_t typecode2;
  uint8_t typecode;
  uint8_t high48 [6];
  uint8_t local_32;
  uint8_t local_31;
  uint local_30;
  ushort local_2c;
  
  local_30 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_2c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  paVar2 = art_find(&r->art,(art_key_chunk_t *)&local_30);
  if (paVar2 == (art_val_t *)0x0) {
    c = (undefined8 *)(*global_memory_hook.malloc)(0x10);
    if (c != (undefined8 *)0x0) {
      *c = 0;
      c[1] = 0;
    }
    pcVar4 = container_add(c,(uint16_t)val,'\x02',&local_31);
    val_00 = add_container(r,pcVar4,local_31);
    art_insert(&r->art,(art_key_chunk_t *)&local_30,val_00);
  }
  else {
    pcVar4 = r->containers[*paVar2 >> 8];
    typecode_00 = (uint8_t)*paVar2;
    pcVar3 = container_add(pcVar4,(uint16_t)val,typecode_00,&local_32);
    if (pcVar3 != pcVar4) {
      container_free(pcVar4,typecode_00);
      uVar1 = *paVar2;
      r->containers[uVar1 >> 8] = pcVar3;
      *paVar2 = CONCAT71((int7)(uVar1 >> 8),local_32);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_add(roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = (leaf_t *)art_find(&r->art, high48);
    containerptr_roaring64_bitmap_add(r, high48, low16, leaf);
}